

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O2

int nni_get_port_by_name(char *name,uint32_t *portp)

{
  ushort uVar1;
  ulong uVar2;
  servent *psVar3;
  char *local_28;
  char *end;
  
  local_28 = (char *)0x0;
  uVar2 = strtol(name,&local_28,10);
  if (0xffff < uVar2 || *local_28 != '\0') {
    psVar3 = getservbyname(name,"tcp");
    if (psVar3 == (servent *)0x0) {
      return 0xf;
    }
    uVar1 = (ushort)psVar3->s_port;
    uVar2 = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
  }
  *portp = (uint32_t)uVar2;
  return 0;
}

Assistant:

int
nni_get_port_by_name(const char *name, uint32_t *portp)
{
	struct servent *se;
	long            port;
	char           *end = NULL;

	port = strtol(name, &end, 10);
	if ((*end == '\0') && (port >= 0) && (port <= 0xffff)) {
		*portp = (uint16_t) port;
		return (0);
	}

	if ((se = getservbyname(name, "tcp")) != NULL) {
		*portp = (uint16_t) ntohs(se->s_port);
		return (0);
	}
	return (NNG_EADDRINVAL);
}